

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

UtcTimeStamp *
FIX::UtcTimeStampConvertor::convert(UtcTimeStamp *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  char *pcVar2;
  FieldConvertError *this;
  int iVar3;
  int day;
  long lVar4;
  int month;
  ulong uVar5;
  int iVar6;
  int year;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  uVar1 = value->_M_string_length;
  if (uVar1 - 0x1c < 0xfffffffffffffff5) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  else {
    pcVar2 = (value->_M_dataplus)._M_p;
    lVar4 = 0;
    do {
      if (9 < (int)pcVar2[lVar4] - 0x30U) {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_0015ded9;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    if (pcVar2[8] == '-') {
      iVar3 = (int)pcVar2[9];
      if (iVar3 - 0x30U < 10) {
        iVar7 = (int)pcVar2[10];
        if (iVar7 - 0x30U < 10) {
          if (pcVar2[0xb] != ':') {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
            goto LAB_0015ded9;
          }
          iVar6 = (int)pcVar2[0xc];
          if (iVar6 - 0x30U < 10) {
            iVar8 = (int)pcVar2[0xd];
            if (iVar8 - 0x30U < 10) {
              if (pcVar2[0xe] != ':') {
                this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                FieldConvertError::FieldConvertError(this,value);
                goto LAB_0015ded9;
              }
              iVar10 = (int)pcVar2[0xf];
              if (iVar10 - 0x30U < 10) {
                iVar9 = (int)pcVar2[0x10];
                if (iVar9 - 0x30U < 10) {
                  if (((int)pcVar2[5] + pcVar2[4] * 10) - 0x21dU < 0xfffffff4) {
                    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                    FieldConvertError::FieldConvertError(this,value);
                  }
                  else if (((int)pcVar2[7] + pcVar2[6] * 10) - 0x230U < 0xffffffe1) {
                    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                    FieldConvertError::FieldConvertError(this,value);
                  }
                  else if ((iVar7 + iVar3 * 10) - 0x1e0U < 0x48) {
                    if ((iVar8 + iVar6 * 10) - 0x1e0U < 0x6c) {
                      if ((iVar9 + iVar10 * 10) - 0x1e0U < 0x6d) {
                        year = pcVar2[3] + -0xd050 +
                               ((int)pcVar2[2] + ((int)pcVar2[1] + *pcVar2 * 10) * 10) * 10;
                        month = pcVar2[5] + -0x210 + pcVar2[4] * 10;
                        day = pcVar2[7] + -0x210 + pcVar2[6] * 10;
                        iVar3 = iVar7 + iVar3 * 10 + -0x210;
                        iVar7 = iVar8 + iVar6 * 10 + -0x210;
                        iVar6 = iVar9 + iVar10 * 10 + -0x210;
                        if (uVar1 == 0x11) {
                          DateTime::DateTime(&__return_storage_ptr__->super_DateTime,year,month,day,
                                             iVar3,iVar7,iVar6,0);
                        }
                        else {
                          if (pcVar2[0x11] != '.') {
                            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                            FieldConvertError::FieldConvertError(this,value);
                            goto LAB_0015ded9;
                          }
                          iVar8 = 0;
                          if (0x12 < uVar1) {
                            uVar5 = 0x12;
                            iVar8 = 0;
                            do {
                              if (9 < (int)pcVar2[uVar5] - 0x30U) {
                                this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                                FieldConvertError::FieldConvertError(this,value);
                                goto LAB_0015ded9;
                              }
                              iVar8 = (int)pcVar2[uVar5] + iVar8 * 10 + -0x30;
                              uVar5 = uVar5 + 1;
                            } while (uVar1 != uVar5);
                          }
                          DateTime::DateTime(&__return_storage_ptr__->super_DateTime,year,month,day,
                                             iVar3,iVar7,iVar6,iVar8,(int)uVar1 + -0x12);
                        }
                        (__return_storage_ptr__->super_DateTime)._vptr_DateTime =
                             (_func_int **)&PTR__DateTime_001ea8f0;
                        return __return_storage_ptr__;
                      }
                      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                      FieldConvertError::FieldConvertError(this,value);
                    }
                    else {
                      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                      FieldConvertError::FieldConvertError(this,value);
                    }
                  }
                  else {
                    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                    FieldConvertError::FieldConvertError(this,value);
                  }
                  goto LAB_0015ded9;
                }
              }
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
              goto LAB_0015ded9;
            }
          }
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
          goto LAB_0015ded9;
        }
      }
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
    else {
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
  }
LAB_0015ded9:
  __cxa_throw(this,&FieldConvertError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

static UtcTimeStamp convert( const std::string& value )
  EXCEPT ( FieldConvertError )
  {
    size_t len = value.size();
    if (len < 17 || len > 27) throw FieldConvertError(value);

    size_t i = 0;
    int c = 0;
    for( c = 0; c < 8; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if (value[i++] != '-') throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);

    int year, mon, mday, hour, min, sec;

    i = 0;

    year = value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';

    mon = value[i++] - '0';
    mon = 10 * mon + value[i++] - '0';
    if( mon < 1 || 12 < mon ) throw FieldConvertError(value);

    mday = value[i++] - '0';
    mday = 10 * mday + value[i++] - '0';
    if( mday < 1 || 31 < mday ) throw FieldConvertError(value);

    ++i; // skip '-'

    hour = value[i++] - '0';
    hour = 10 * hour + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 23 < hour ) throw FieldConvertError(value);

    ++i; // skip ':'

    min = value[i++] - '0';
    min = 10 * min + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 59 < min ) throw FieldConvertError(value);

    ++i; // skip ':'

    sec = value[i++] - '0';
    sec = 10 * sec + value[i++] - '0';

    // No check for >= 0 as no '-' are converted here
    if( 60 < sec ) throw FieldConvertError(value);

    if (len == 17)
      return UtcTimeStamp (hour, min, sec, 0,
                           mday, mon, year);

    if( value[i++] != '.' ) throw FieldConvertError(value);

    int fraction = 0;
    for (; i < len; ++i)
    {
      char ch = value[i];
      if( !IS_DIGIT(ch)) throw FieldConvertError(value);
      fraction = (fraction * 10) + ch - '0';
    }

    return UtcTimeStamp (hour, min, sec, fraction,
                         mday, mon, year, len - 17 - 1);
  }